

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

WeakArenaReference<Js::IDiagObjectModelDisplay> * __thiscall
Js::ResolvedObject::GetObjectDisplay(ResolvedObject *this)

{
  LONG *pLVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IDiagObjectModelDisplay *pIVar5;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar6;
  ReferencedArenaAdapter *pRVar7;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (this->typeId == TypeIds_HostDispatch) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x3d,"(typeId != TypeIds_HostDispatch)",
                                "Bad usage of ResolvedObject::GetObjectDisplay");
    if (!bVar3) goto LAB_008bbeeb;
    *puVar4 = 0;
  }
  pIVar5 = this->objectDisplay;
  if (pIVar5 == (IDiagObjectModelDisplay *)0x0) {
    pIVar5 = CreateDisplay(this);
  }
  if (pIVar5 == (IDiagObjectModelDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x40,"(pOMDisplay)","pOMDisplay");
    if (!bVar3) {
LAB_008bbeeb:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_50 = (undefined1  [8])&Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3d84632;
  data.filename._0_4_ = 0x42;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
  pWVar6 = (WeakArenaReference<Js::IDiagObjectModelDisplay> *)
           new<Memory::HeapAllocator>(0x10,alloc,0x300d4a);
  pRVar7 = DebugManager::GetDiagnosticArena(this->scriptContext->threadContext->debugManager);
  pWVar6->adapter = pRVar7;
  pWVar6->p = pIVar5;
  LOCK();
  pLVar1 = &(pRVar7->super_RefCounted).refCount;
  *pLVar1 = *pLVar1 + 1;
  UNLOCK();
  return pWVar6;
}

Assistant:

WeakArenaReference<IDiagObjectModelDisplay>* ResolvedObject::GetObjectDisplay()
    {
        AssertMsg(typeId != TypeIds_HostDispatch, "Bad usage of ResolvedObject::GetObjectDisplay");

        IDiagObjectModelDisplay* pOMDisplay = (this->objectDisplay != nullptr) ? this->objectDisplay : CreateDisplay();
        Assert(pOMDisplay);

        return HeapNew(WeakArenaReference<IDiagObjectModelDisplay>, scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena(), pOMDisplay);
    }